

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsread.c
# Opt level: O0

int32_t conv_code_phits2pdg(int32_t c)

{
  int iVar1;
  int local_38;
  int local_2c;
  long abspdgcode;
  long Z;
  long A;
  int32_t absc;
  int32_t c_local;
  int local_4;
  
  local_2c = c;
  if (c < 0) {
    local_2c = -c;
  }
  if (c == 0) {
    local_4 = 0;
  }
  else {
    local_4 = c;
    if (999999 < local_2c) {
      iVar1 = local_2c % 1000000;
      local_2c = local_2c / 1000000;
      if ((((local_2c == 0) || (0x82 < local_2c)) || (iVar1 < local_2c)) || (500 < iVar1)) {
        local_4 = 0;
      }
      else {
        iVar1 = iVar1 + (local_2c + 100000) * 1000;
        local_38 = iVar1 * 10;
        if (c < 0) {
          local_38 = iVar1 * -10;
        }
        local_4 = local_38;
      }
    }
  }
  return local_4;
}

Assistant:

int32_t conv_code_phits2pdg( int32_t c )
{
  int32_t absc = c < 0 ? -c : c;
  if (!c)
    return 0;
  if (absc<1000000) {
    //Presumably PHITS use pdg codes directly for non-nuclei/ions
    return c;
  }
  //PHITS encode nucleis as Z*1000000+A
  long A = absc % 1000000;
  long Z = absc / 1000000;
  if (!Z||Z>130||A<Z||A>500)//Just picking max Z=130, A=500 as a quick sanity check - could tighten this!
    return 0;//impossible
  //PDG format for ions is 10LZZZAAAI, where L!=0 indicates strangeness
  //and I!=0 indicates exited nuclei. We only allow L=I=0 ions here.
  long abspdgcode = 10 * (A + 1000*(Z+100000));
  return (int32_t) ( c < 0 ? -abspdgcode : abspdgcode );
}